

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfref.cpp
# Opt level: O0

vm_obj_id_t CVmObjFrameRef::create(vm_val_t *fp,uchar *entry)

{
  vm_obj_id_t obj_id;
  size_t in_RSI;
  vm_obj_id_t id;
  vm_val_t *in_stack_00000018;
  CVmObjFrameRef *in_stack_00000020;
  int in_stack_ffffffffffffffec;
  
  obj_id = vm_new_id((int)(in_RSI >> 0x20),(int)in_RSI,in_stack_ffffffffffffffec);
  CVmObject::operator_new(in_RSI,obj_id);
  CVmObjFrameRef(in_stack_00000020,in_stack_00000018,(uchar *)fp);
  return obj_id;
}

Assistant:

vm_obj_id_t CVmObjFrameRef::create(
    VMG_ vm_val_t *fp, const uchar *entry)
{
    /* allocate an object ID */
    vm_obj_id_t id = vm_new_id(vmg_ FALSE, TRUE, FALSE);

    /* instantiate the new object */
    new (vmg_ id) CVmObjFrameRef(vmg_ fp, entry);

    /* return the new object's ID */
    return id;
}